

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O0

Abc_Cex_t * Saig_ManCbaFindCexCareBits(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  abctime aVar6;
  Saig_ManCba_t *p_00;
  Aig_Man_t *pAVar7;
  Vec_Int_t *vReasons_00;
  Vec_Int_t *p_01;
  abctime aVar8;
  Abc_Cex_t *p_02;
  Vec_Int_t *vRes;
  abctime clk;
  Abc_Cex_t *pCare;
  Vec_Int_t *vReasons;
  Saig_ManCba_t *p;
  int fVerbose_local;
  int nInputs_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  Abc_Clock();
  aVar6 = Abc_Clock();
  p_00 = Saig_ManCbaStart(pAig,pCex,nInputs,fVerbose);
  pAVar7 = Saig_ManCbaUnrollWithCex(pAig,pCex,nInputs,&p_00->vMapPiF2A,&p_00->vReg2Frame);
  p_00->pFrames = pAVar7;
  vReasons_00 = Saig_ManCbaFindReason(p_00);
  if (p_00->vReg2Frame != (Vec_Vec_t *)0x0) {
    Saig_ManCbaShrink(p_00);
  }
  if (fVerbose != 0) {
    p_01 = Saig_ManCbaReason2Inputs(p_00,vReasons_00);
    uVar2 = Aig_ManCiNum(p_00->pFrames);
    uVar3 = Vec_IntSize(vReasons_00);
    iVar4 = Saig_ManPiNum(p_00->pAig);
    iVar1 = p_00->nInputs;
    uVar5 = Vec_IntSize(p_01);
    printf("Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",(ulong)uVar2,
           (ulong)uVar3,(ulong)(uint)(iVar4 - iVar1),(ulong)uVar5);
    Vec_IntFree(p_01);
    Abc_Print(1,"%s =","Time");
    aVar8 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar6) * 1.0) / 1000000.0);
  }
  p_02 = Saig_ManCbaReason2Cex(p_00,vReasons_00);
  Vec_IntFree(vReasons_00);
  Saig_ManCbaStop(p_00);
  if (fVerbose != 0) {
    printf("Real ");
    Abc_CexPrintStats(pCex);
    printf("Care ");
    Abc_CexPrintStats(p_02);
  }
  Aig_ManCleanMarkAB(pAig);
  return p_02;
}

Assistant:

Abc_Cex_t * Saig_ManCbaFindCexCareBits( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, int fVerbose )
{
    Saig_ManCba_t * p;
    Vec_Int_t * vReasons;
    Abc_Cex_t * pCare;
    abctime clk = Abc_Clock();

    clk = Abc_Clock();
    p = Saig_ManCbaStart( pAig, pCex, nInputs, fVerbose );

//    p->vReg2Frame = Vec_VecStart( pCex->iFrame );
//    p->vReg2Value = Vec_VecStart( pCex->iFrame );
    p->pFrames = Saig_ManCbaUnrollWithCex( pAig, pCex, nInputs, &p->vMapPiF2A, &p->vReg2Frame );
    vReasons = Saig_ManCbaFindReason( p );
    if ( p->vReg2Frame )
        Saig_ManCbaShrink( p );


//if ( fVerbose )
//Aig_ManPrintStats( p->pFrames );

    if ( fVerbose )
    {
        Vec_Int_t * vRes = Saig_ManCbaReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
        Vec_IntFree( vRes );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

    pCare = Saig_ManCbaReason2Cex( p, vReasons );
    Vec_IntFree( vReasons );
    Saig_ManCbaStop( p );

if ( fVerbose )
{
printf( "Real " );
Abc_CexPrintStats( pCex );
}
if ( fVerbose )
{
printf( "Care " );
Abc_CexPrintStats( pCare );
}
/*
    // verify the reduced counter-example using ternary simulation
    if ( !Saig_ManCexVerifyUsingTernary( pAig, pCex, pCare ) )
        printf( "Saig_ManCbaFindCexCareBits(): Minimized counter-example verification has failed!!!\n" );
    else if ( fVerbose )
        printf( "Saig_ManCbaFindCexCareBits(): Minimized counter-example verification is successful.\n" );
*/
    Aig_ManCleanMarkAB( pAig );
    return pCare;
}